

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O2

QSize operator/(QSize *s,qreal c)

{
  undefined4 in_EAX;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar8._0_8_ = (double)(*s).wd.m_i;
  auVar8._8_8_ = (double)(*s).ht.m_i;
  auVar6._8_8_ = c;
  auVar6._0_8_ = c;
  auVar9 = divpd(auVar8,auVar6);
  dVar5 = (double)((ulong)auVar9._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar9._0_8_;
  dVar7 = (double)((ulong)auVar9._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar9._8_8_;
  auVar9._4_4_ = -(uint)(-2147483648.0 < dVar5);
  auVar9._0_4_ = -(uint)(-2147483648.0 < dVar7);
  auVar9._8_4_ = -(uint)(2147483647.0 < dVar7);
  auVar9._12_4_ = -(uint)(2147483647.0 < dVar5);
  uVar1 = movmskps(in_EAX,auVar9);
  uVar4 = 0x80000000;
  if ((uVar1 & 2) != 0) {
    uVar4 = (ulong)(uint)(int)dVar5;
  }
  uVar2 = 0x8000000000000000;
  if ((uVar1 & 1) != 0) {
    uVar2 = (ulong)(uint)(int)dVar7 << 0x20;
  }
  uVar3 = 0x7fffffff00000000;
  if ((uVar1 & 4) == 0) {
    uVar3 = uVar2;
  }
  uVar2 = 0x7fffffff;
  if ((uVar1 & 8) == 0) {
    uVar2 = uVar4;
  }
  return (QSize)(uVar2 | uVar3);
}

Assistant:

friend inline QSize operator/(const QSize &s, qreal c)
    {
        Q_ASSERT(!qFuzzyIsNull(c));
        return QSize(QtPrivate::qSaturateRound(s.width() / c), QtPrivate::qSaturateRound(s.height() / c));
    }